

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bucket.cpp
# Opt level: O3

void __thiscall bucket::insert(bucket *this,index index)

{
  pointer *ppiVar1;
  iterator __position;
  index local_18;
  
  local_18.value = index.value;
  local_18._0_8_ = index._0_8_;
  __position._M_current =
       (this->indices).super__Vector_base<index,_std::allocator<index>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (this->indices).super__Vector_base<index,_std::allocator<index>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<index,std::allocator<index>>::_M_realloc_insert<index_const&>
              ((vector<index,std::allocator<index>> *)&this->indices,__position,&local_18);
  }
  else {
    (__position._M_current)->value = local_18.value;
    (__position._M_current)->file_id = local_18.file_id;
    (__position._M_current)->page_id = local_18.page_id;
    (__position._M_current)->record_id = local_18.record_id;
    *(short *)&(__position._M_current)->field_0x6 = local_18._6_2_;
    ppiVar1 = &(this->indices).super__Vector_base<index,_std::allocator<index>_>._M_impl.
               super__Vector_impl_data._M_finish;
    *ppiVar1 = *ppiVar1 + 1;
  }
  this->size = this->size + '\x01';
  return;
}

Assistant:

void bucket::insert(index index) {
    indices.push_back(index);
    size++;
}